

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

int SSL_marshal_ech_config
              (uint8_t **out,size_t *out_len,uint8_t config_id,EVP_HPKE_KEY *key,char *public_name,
              size_t max_name_len)

{
  StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *this;
  bool bVar1;
  uint16_t value;
  int iVar2;
  cbb_st *pcVar3;
  EVP_HPKE_KEM *kem;
  uchar *data;
  size_t len;
  char *extraout_RDX;
  string_view s;
  Span<const_unsigned_char> public_name_00;
  size_t local_110;
  size_t public_key_len;
  uint8_t *public_key;
  CBB child;
  CBB contents;
  ScopedCBB cbb;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined1 local_50 [8];
  Span<const_unsigned_char> public_name_u8;
  size_t max_name_len_local;
  char *public_name_local;
  EVP_HPKE_KEY *key_local;
  uint8_t config_id_local;
  size_t *out_len_local;
  uint8_t **out_local;
  
  public_name_u8.size_ = max_name_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,public_name);
  s._M_str = extraout_RDX;
  s._M_len = (size_t)local_60._M_str;
  _local_50 = bssl::StringAsBytes((bssl *)local_60._M_len,s);
  public_name_00.size_ = (uchar *)local_50._8_8_;
  public_name_00.data_ = public_name_00.size_;
  bVar1 = bssl::ssl_is_valid_ech_public_name((bssl *)local_50,public_name_00);
  if (!bVar1) {
    ERR_put_error(0x10,0,0x13d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,0x3d0);
    return 0;
  }
  if (0xff < public_name_u8.size_) {
    ERR_put_error(0x10,0,0x6f,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,0x3d6);
    return 0;
  }
  this = (StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&contents.u + 0x18);
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated(this);
  pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get(this);
  iVar2 = CBB_init(pcVar3,0x80);
  if (iVar2 != 0) {
    pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&contents.u + 0x18));
    iVar2 = CBB_add_u16(pcVar3,0xfe0d);
    if (iVar2 != 0) {
      pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                          ((long)&contents.u + 0x18));
      iVar2 = CBB_add_u16_length_prefixed(pcVar3,(CBB *)((long)&child.u + 0x18));
      if ((iVar2 != 0) && (iVar2 = CBB_add_u8((CBB *)((long)&child.u + 0x18),config_id), iVar2 != 0)
         ) {
        kem = EVP_HPKE_KEY_kem(key);
        value = EVP_HPKE_KEM_id(kem);
        iVar2 = CBB_add_u16((CBB *)((long)&child.u + 0x18),value);
        if (((iVar2 != 0) &&
            ((((iVar2 = CBB_add_u16_length_prefixed
                                  ((CBB *)((long)&child.u + 0x18),(CBB *)&public_key), iVar2 != 0 &&
               (iVar2 = CBB_reserve((CBB *)&public_key,(uint8_t **)&public_key_len,0x41), iVar2 != 0
               )) && (iVar2 = EVP_HPKE_KEY_public_key(key,(uint8_t *)public_key_len,&local_110,0x41)
                     , iVar2 != 0)) &&
             ((iVar2 = CBB_did_write((CBB *)&public_key,local_110), iVar2 != 0 &&
              (iVar2 = CBB_add_u16_length_prefixed
                                 ((CBB *)((long)&child.u + 0x18),(CBB *)&public_key), iVar2 != 0))))
            )) && ((iVar2 = CBB_add_u16((CBB *)&public_key,1), iVar2 != 0 &&
                   (((iVar2 = CBB_add_u16((CBB *)&public_key,1), iVar2 != 0 &&
                     (iVar2 = CBB_add_u16((CBB *)&public_key,1), iVar2 != 0)) &&
                    (iVar2 = CBB_add_u16((CBB *)&public_key,3), iVar2 != 0)))))) {
          iVar2 = CBB_add_u8((CBB *)((long)&child.u + 0x18),(uint8_t)public_name_u8.size_);
          if ((iVar2 != 0) &&
             (iVar2 = CBB_add_u8_length_prefixed((CBB *)((long)&child.u + 0x18),(CBB *)&public_key),
             iVar2 != 0)) {
            data = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_50);
            len = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_50);
            iVar2 = CBB_add_bytes((CBB *)&public_key,data,len);
            if ((iVar2 != 0) && (iVar2 = CBB_add_u16((CBB *)((long)&child.u + 0x18),0), iVar2 != 0))
            {
              pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  ((long)&contents.u + 0x18));
              iVar2 = CBB_finish(pcVar3,out,out_len);
              if (iVar2 != 0) {
                out_local._4_4_ = 1;
                goto LAB_00330d5f;
              }
            }
          }
        }
      }
    }
  }
  ERR_put_error(0x10,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                ,0x3f6);
  out_local._4_4_ = 0;
LAB_00330d5f:
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&contents.u + 0x18));
  return out_local._4_4_;
}

Assistant:

int SSL_marshal_ech_config(uint8_t **out, size_t *out_len, uint8_t config_id,
                           const EVP_HPKE_KEY *key, const char *public_name,
                           size_t max_name_len) {
  Span<const uint8_t> public_name_u8 = StringAsBytes(public_name);
  if (!ssl_is_valid_ech_public_name(public_name_u8)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_ECH_PUBLIC_NAME);
    return 0;
  }

  // The maximum name length is encoded in one byte.
  if (max_name_len > 0xff) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_LENGTH);
    return 0;
  }

  // See draft-ietf-tls-esni-13, section 4.
  ScopedCBB cbb;
  CBB contents, child;
  uint8_t *public_key;
  size_t public_key_len;
  if (!CBB_init(cbb.get(), 128) ||  //
      !CBB_add_u16(cbb.get(), kECHConfigVersion) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &contents) ||
      !CBB_add_u8(&contents, config_id) ||
      !CBB_add_u16(&contents, EVP_HPKE_KEM_id(EVP_HPKE_KEY_kem(key))) ||
      !CBB_add_u16_length_prefixed(&contents, &child) ||
      !CBB_reserve(&child, &public_key, EVP_HPKE_MAX_PUBLIC_KEY_LENGTH) ||
      !EVP_HPKE_KEY_public_key(key, public_key, &public_key_len,
                               EVP_HPKE_MAX_PUBLIC_KEY_LENGTH) ||
      !CBB_did_write(&child, public_key_len) ||
      !CBB_add_u16_length_prefixed(&contents, &child) ||
      // Write a default cipher suite configuration.
      !CBB_add_u16(&child, EVP_HPKE_HKDF_SHA256) ||
      !CBB_add_u16(&child, EVP_HPKE_AES_128_GCM) ||
      !CBB_add_u16(&child, EVP_HPKE_HKDF_SHA256) ||
      !CBB_add_u16(&child, EVP_HPKE_CHACHA20_POLY1305) ||
      !CBB_add_u8(&contents, max_name_len) ||
      !CBB_add_u8_length_prefixed(&contents, &child) ||
      !CBB_add_bytes(&child, public_name_u8.data(), public_name_u8.size()) ||
      // TODO(https://crbug.com/boringssl/275): Reserve some GREASE extensions
      // and include some.
      !CBB_add_u16(&contents, 0 /* no extensions */) ||
      !CBB_finish(cbb.get(), out, out_len)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return 0;
  }
  return 1;
}